

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

Float __thiscall
pbrt::MeasuredBxDF::PDF
          (MeasuredBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  float fVar11;
  undefined1 auVar12 [64];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar13 [16];
  Float FVar14;
  Vector3<float> VVar15;
  PLSample PVar16;
  Vector3f wm;
  Float params [2];
  Tuple3<pbrt::Vector3,_float> local_68;
  float local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38;
  uint uStack_34;
  undefined4 uStack_30;
  uint uStack_2c;
  undefined1 local_28 [16];
  float local_18;
  float local_14;
  undefined1 extraout_var [60];
  undefined1 auVar10 [56];
  
  uStack_30 = 0;
  local_38 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._8_56_ = wi._8_56_;
  auVar12._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_48 = auVar12._0_16_;
  local_68.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._8_56_ = wo._8_56_;
  auVar7._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5 = auVar7._0_16_;
  FVar14 = 0.0;
  if (((sampleFlags & Reflection) != Unset) && (0.0 < local_68.z * local_38)) {
    if (local_68.z < 0.0) {
      auVar5._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar5._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      auVar5._12_4_ = wo._12_4_ ^ 0x80000000;
      local_68.z = -local_68.z;
      local_48._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      local_48._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      local_48._12_4_ = wi._12_4_ ^ 0x80000000;
      local_38 = -local_38;
      in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
      uStack_30 = 0x80000000;
      in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
    }
    auVar6._0_4_ = local_48._0_4_ + auVar5._0_4_;
    auVar6._4_4_ = local_48._4_4_ + auVar5._4_4_;
    auVar6._8_4_ = local_48._8_4_ + auVar5._8_4_;
    auVar6._12_4_ = local_48._12_4_ + auVar5._12_4_;
    auVar10 = ZEXT856(auVar6._8_8_);
    local_68.z = local_38 + local_68.z;
    FVar14 = 0.0;
    auVar13._0_4_ = auVar6._0_4_ * auVar6._0_4_;
    auVar13._4_4_ = auVar6._4_4_ * auVar6._4_4_;
    auVar13._8_4_ = auVar6._8_4_ * auVar6._8_4_;
    auVar13._12_4_ = auVar6._12_4_ * auVar6._12_4_;
    local_68._0_8_ = vmovlps_avx(auVar6);
    auVar5 = vmovshdup_avx(auVar13);
    auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_68.z),ZEXT416((uint)local_68.z));
    if ((auVar5._0_4_ != 0.0) || (NAN(auVar5._0_4_))) {
      uStack_34 = in_XMM3_Db;
      uStack_2c = in_XMM3_Dd;
      VVar15 = Normalize<float>((Vector3<float> *)&local_68);
      local_68.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar10;
      local_68._0_8_ = vmovlps_avx(auVar8._0_16_);
      fVar3 = SafeACos(local_38);
      local_28 = vmovshdup_avx(local_48);
      local_5c = atan2f(local_28._0_4_,local_48._0_4_);
      local_58._0_4_ = SafeACos(local_68.z);
      fVar4 = atan2f(local_68.y,local_68.x);
      fVar11 = (float)local_58._0_4_ * 0.63661975;
      if (fVar11 < 0.0) {
        local_58._4_4_ = extraout_XMM0_Db;
        local_58._0_4_ = fVar4;
        local_58._8_4_ = extraout_XMM0_Dc;
        local_58._12_4_ = extraout_XMM0_Dd;
        auVar9._0_4_ = sqrtf(fVar11);
        auVar9._4_60_ = extraout_var;
        auVar5 = auVar9._0_16_;
      }
      else {
        auVar5 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
        local_58._0_4_ = fVar4;
      }
      bVar1 = this->brdf->isotropic;
      local_18 = local_5c;
      fVar11 = ((float)((uint)(bVar1 & 1) * (int)((float)local_58._0_4_ - local_5c) +
                       (uint)!(bool)(bVar1 & 1) * local_58._0_4_) + 3.1415927) / 6.2831855;
      auVar6 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
      auVar6 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar11 - auVar6._0_4_)),0x10);
      local_58 = auVar5;
      local_14 = fVar3;
      PVar16 = PiecewiseLinear2D<2UL>::Invert(&this->brdf->vndf,(Vector2f)auVar6._0_8_,&local_18);
      fVar11 = PiecewiseLinear2D<2UL>::Evaluate
                         (&this->brdf->luminance,PVar16.p.super_Tuple2<pbrt::Vector2,_float>,
                          &local_18);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_68.y * (float)local_28._0_4_)),
                               ZEXT416((uint)local_68.x),ZEXT416((uint)local_48._0_4_));
      auVar2._4_4_ = uStack_34;
      auVar2._0_4_ = local_38;
      auVar2._8_4_ = uStack_30;
      auVar2._12_4_ = uStack_2c;
      auVar5 = ZEXT416((uint)(local_68.x * local_68.x + local_68.y * local_68.y));
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      auVar6 = vfmadd231ss_fma(auVar6,auVar2,ZEXT416((uint)local_68.z));
      auVar5 = vmaxss_avx(SUB6416(ZEXT464(0x358637bd),0),
                          ZEXT416((uint)((float)local_58._0_4_ * 19.73921 * auVar5._0_4_)));
      FVar14 = (fVar11 * PVar16.pdf) / (auVar6._0_4_ * 4.0 * auVar5._0_4_);
    }
  }
  return FVar14;
}

Assistant:

Float MeasuredBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        return 0;
    if (!SameHemisphere(wo, wi))
        return 0;
    if (wo.z < 0) {
        wo = -wo;
        wi = -wi;
    }

    Vector3f wm = wi + wo;
    if (LengthSquared(wm) == 0)
        return 0;
    wm = Normalize(wm);

    /* Cartesian -> spherical coordinates */
    Float theta_i = SphericalTheta(wi), phi_i = std::atan2(wi.y, wi.x);
    Float theta_m = SphericalTheta(wm), phi_m = std::atan2(wm.y, wm.x);

    /* Spherical coordinates -> unit coordinate system */
    Vector2f u_wm(theta2u(theta_m), phi2u(brdf->isotropic ? (phi_m - phi_i) : phi_m));
    u_wm.y = u_wm.y - std::floor(u_wm.y);

    Float params[2] = {phi_i, theta_i};
    auto ui = brdf->vndf.Invert(u_wm, params);
    Vector2f sample = ui.p;
    Float vndfPDF = ui.pdf;

    Float pdf = brdf->luminance.Evaluate(sample, params);
    Float sinTheta_m = std::sqrt(Sqr(wm.x) + Sqr(wm.y));
    Float jacobian =
        4.f * Dot(wi, wm) * std::max<Float>(2 * Sqr(Pi) * u_wm.x * sinTheta_m, 1e-6f);
    return vndfPDF * pdf / jacobian;
}